

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_socket.c
# Opt level: O0

int skynet_socket_poll(void)

{
  uint uVar1;
  int local_3c;
  int type;
  int more;
  socket_message result;
  socket_server *ss;
  
  result.data = (char *)SOCKET_SERVER;
  if (SOCKET_SERVER != (socket_server *)0x0) {
    local_3c = 1;
    uVar1 = socket_server_poll(SOCKET_SERVER,(socket_message *)&type,&local_3c);
    switch(uVar1) {
    case 0:
      forward_message(1,false,(socket_message *)&type);
      break;
    case 1:
      forward_message(3,false,(socket_message *)&type);
      break;
    case 2:
      forward_message(2,true,(socket_message *)&type);
      break;
    case 3:
      forward_message(4,true,(socket_message *)&type);
      break;
    case 4:
      forward_message(5,true,(socket_message *)&type);
      break;
    case 5:
      return 0;
    case 6:
      forward_message(6,false,(socket_message *)&type);
      break;
    default:
      skynet_error((skynet_context *)0x0,"Unknown socket message type %d.",(ulong)uVar1);
      return -1;
    }
    if (local_3c == 0) {
      ss._4_4_ = 1;
    }
    else {
      ss._4_4_ = -1;
    }
    return ss._4_4_;
  }
  __assert_fail("ss",
                "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/skynet_socket.c"
                ,0x4c,"int skynet_socket_poll()");
}

Assistant:

int 
skynet_socket_poll() {
	struct socket_server *ss = SOCKET_SERVER;
	assert(ss);
	struct socket_message result;
	int more = 1;
	int type = socket_server_poll(ss, &result, &more);
	switch (type) {
	case SOCKET_EXIT:
		return 0;
	case SOCKET_DATA:
		forward_message(SKYNET_SOCKET_TYPE_DATA, false, &result);
		break;
	case SOCKET_CLOSE:
		forward_message(SKYNET_SOCKET_TYPE_CLOSE, false, &result);
		break;
	case SOCKET_OPEN:
		forward_message(SKYNET_SOCKET_TYPE_CONNECT, true, &result);
		break;
	case SOCKET_ERROR:
		forward_message(SKYNET_SOCKET_TYPE_ERROR, true, &result);
		break;
	case SOCKET_ACCEPT:
		forward_message(SKYNET_SOCKET_TYPE_ACCEPT, true, &result);
		break;
	case SOCKET_UDP:
		forward_message(SKYNET_SOCKET_TYPE_UDP, false, &result);
		break;
	default:
		skynet_error(NULL, "Unknown socket message type %d.",type);
		return -1;
	}
	if (more) {
		return -1;
	}
	return 1;
}